

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O2

void srunner_run_tagged(SRunner *sr,char *sname,char *tcname,char *include_tags,char *exclude_tags,
                       print_output print_mode)

{
  char cVar1;
  TTest *pTVar2;
  List *lp;
  fork_status fVar3;
  int iVar4;
  uint uVar5;
  __pid_t __pid;
  clockid_t cVar6;
  __pid_t _Var7;
  int waserror;
  Suite *s;
  TCase *pTVar8;
  TestResult *pTVar9;
  TF *pTVar10;
  char *pcVar11;
  char *pcVar12;
  char cVar13;
  List *pLVar14;
  uint __sig;
  int status;
  int local_f4;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  List *local_d0;
  List *local_c8;
  SRunner *local_c0;
  timer_t timerid;
  Suite *local_b0;
  List *local_a8;
  List *local_a0;
  List *local_98;
  TCase *local_90;
  timespec *local_88;
  TF *local_80;
  timespec ts_end;
  timespec ts_start;
  itimerspec local_58;
  
  local_f0 = tcname;
  local_e8 = exclude_tags;
  if (tcname == (char *)0x0) {
    local_f0 = getenv("CK_RUN_CASE");
  }
  if (sname == (char *)0x0) {
    sname = getenv("CK_RUN_SUITE");
  }
  local_d8 = sname;
  if (include_tags == (char *)0x0) {
    include_tags = getenv("CK_INCLUDE_TAGS");
  }
  if (local_e8 == (char *)0x0) {
    local_e8 = getenv("CK_EXCLUDE_TAGS");
  }
  if (sr != (SRunner *)0x0) {
    local_e0 = include_tags;
    if (CK_ENV < print_mode) {
      eprintf("Bad print_mode argument to srunner_run_all: %d",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
              ,0x31e,(ulong)print_mode);
    }
    memset(&srunner_run_tagged::sigalarm_new_action.sa_mask,0,0x90);
    srunner_run_tagged::sigalarm_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(0xe,(sigaction *)&srunner_run_tagged::sigalarm_new_action,
              (sigaction *)&srunner_run_tagged::sigalarm_old_action);
    memset(&srunner_run_tagged::sigint_new_action.sa_mask,0,0x90);
    srunner_run_tagged::sigint_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(2,(sigaction *)&srunner_run_tagged::sigint_new_action,(sigaction *)&sigint_old_action)
    ;
    memset(&srunner_run_tagged::sigterm_new_action.sa_mask,0,0x90);
    srunner_run_tagged::sigterm_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(0xf,(sigaction *)&srunner_run_tagged::sigterm_new_action,
              (sigaction *)&sigterm_old_action);
    fVar3 = srunner_fork_status(sr);
    set_fork_status(fVar3);
    setup_messaging();
    srunner_init_logging(sr,print_mode);
    log_srunner_start(sr);
    pcVar11 = local_e0;
    pLVar14 = sr->slst;
    local_c8 = tag_string_to_list(local_e0);
    local_d0 = tag_string_to_list(local_e8);
    check_list_front(pLVar14);
    local_c0 = sr;
    local_a8 = pLVar14;
    while (iVar4 = check_list_at_end(pLVar14), lp = local_c8, iVar4 == 0) {
      s = (Suite *)check_list_val(pLVar14);
      if (((local_d8 == (char *)0x0) || (iVar4 = strcmp(local_d8,s->name), iVar4 == 0)) &&
         ((local_f0 == (char *)0x0 || (iVar4 = suite_tcase(s,local_f0), iVar4 != 0)))) {
        log_suite_start(sr,s);
        pLVar14 = s->tclst;
        local_b0 = s;
        check_list_front(pLVar14);
        local_a0 = pLVar14;
        while (iVar4 = check_list_at_end(pLVar14), iVar4 == 0) {
          pTVar8 = (TCase *)check_list_val(pLVar14);
          if (((local_f0 == (char *)0x0) || (iVar4 = strcmp(local_f0,pTVar8->name), iVar4 == 0)) &&
             (((pcVar11 == (char *)0x0 || (uVar5 = tcase_matching_tag(pTVar8,local_c8), uVar5 != 0))
              && ((local_e8 == (char *)0x0 ||
                  (uVar5 = tcase_matching_tag(pTVar8,local_d0), uVar5 == 0)))))) {
            set_fork_status(CK_NOFORK);
            pTVar9 = srunner_run_setup(pTVar8->unch_sflst,CK_NOFORK,pTVar8->name,"unchecked_setup");
            fVar3 = srunner_fork_status(sr);
            set_fork_status(fVar3);
            if ((pTVar9 == (TestResult *)0x0) || (pTVar9->rtype == CK_PASS)) {
              pLVar14 = pTVar8->tflst;
              check_list_front(pLVar14);
              local_88 = &pTVar8->timeout;
              local_98 = pLVar14;
              local_90 = pTVar8;
              while (iVar4 = check_list_at_end(pLVar14), iVar4 == 0) {
                pTVar10 = (TF *)check_list_val(pLVar14);
                local_80 = pTVar10;
                for (iVar4 = pTVar10->loop_start; pLVar14 = local_98, iVar4 < pTVar10->loop_end;
                    iVar4 = iVar4 + 1) {
                  log_test_start(sr,pTVar8,pTVar10);
                  fVar3 = srunner_fork_status(sr);
                  if (fVar3 == CK_NOFORK) {
                    pTVar9 = tcase_run_tfun_nofork(sr,pTVar8,pTVar10,iVar4);
                    goto LAB_00106106;
                  }
                  if (fVar3 != CK_FORK) {
                    pcVar11 = "Bad fork status in SRunner";
                    iVar4 = 0x10b;
LAB_001063cb:
                    eprintf(pcVar11,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
                            ,iVar4);
                  }
                  status = 0;
                  ts_start.tv_sec = 0;
                  ts_start.tv_nsec = 0;
                  ts_end.tv_sec = 0;
                  ts_end.tv_nsec = 0;
                  local_f4 = iVar4;
                  __pid = fork();
                  if (__pid == 0) {
                    setpgid(0,0);
                    group_pid = getpgrp();
                    pTVar9 = tcase_run_checked_setup(sr,pTVar8);
                    free(pTVar9);
                    cVar6 = check_get_clockid();
                    clock_gettime(cVar6,(timespec *)&ts_start);
                    pTVar2 = pTVar10->ttest;
                    tcase_fn_start(pTVar2->name,pTVar2->file,pTVar2->line);
                    (*pTVar10->ttest->fn)(local_f4);
                    cVar6 = check_get_clockid();
                    clock_gettime(cVar6,(timespec *)&ts_end);
                    tcase_run_checked_teardown(pTVar8);
                    send_duration_info(((int)ts_end.tv_sec - (int)ts_start.tv_sec) * 1000000 +
                                       (int)(ts_end.tv_nsec / 1000) +
                                       (int)(ts_start.tv_nsec / -1000));
                    exit(0);
                  }
                  if (__pid == -1) {
                    pcVar11 = "Error in call to fork:";
                    iVar4 = 0x1e5;
                    goto LAB_001063cb;
                  }
                  alarm_received = '\0';
                  group_pid = __pid;
                  cVar6 = check_get_clockid();
                  iVar4 = timer_create(cVar6,(sigevent *)0x0,&timerid);
                  if (iVar4 != 0) {
                    pcVar11 = "Error in call to timer_create:";
                    iVar4 = 0x218;
                    goto LAB_001063cb;
                  }
                  local_58.it_value.tv_sec = local_88->tv_sec;
                  local_58.it_value.tv_nsec = local_88->tv_nsec;
                  local_58.it_interval.tv_sec = 0;
                  local_58.it_interval.tv_nsec = 0;
                  iVar4 = timer_settime(timerid,0,&local_58,(itimerspec *)0x0);
                  if (iVar4 != 0) {
                    pcVar11 = "Error in call to timer_settime:";
                    iVar4 = 0x210;
                    goto LAB_001063cb;
                  }
                  do {
                    _Var7 = waitpid(__pid,&status,0);
                  } while (_Var7 == -1);
                  timer_delete(timerid);
                  killpg(__pid,9);
                  iVar4 = status;
                  pcVar11 = pTVar8->name;
                  pcVar12 = pTVar10->ttest->name;
                  uVar5 = pTVar10->signal;
                  cVar1 = pTVar10->allowed_exit_value;
                  waserror = ::waserror(status,uVar5);
                  pTVar9 = receive_test_result(waserror);
                  sr = local_c0;
                  if (pTVar9 == (TestResult *)0x0) {
                    pcVar11 = "Failed to receive test result";
                    iVar4 = 0x22c;
                    goto LAB_001063cb;
                  }
                  pTVar9->tcname = pcVar11;
                  pTVar9->tname = pcVar12;
                  pTVar9->iter = local_f4;
                  __sig = iVar4 & 0x7f;
                  if ((int)(__sig * 0x1000000 + 0x1000000) < 0x2000000) {
                    cVar13 = (char)((uint)iVar4 >> 8);
                    pTVar10 = local_80;
                    pTVar8 = local_90;
                    iVar4 = local_f4;
                    if (uVar5 == 0) {
                      if (__sig == 0) {
                        if ((int)cVar13 == (int)cVar1) {
                          pTVar9->rtype = CK_PASS;
                          free(pTVar9->msg);
                          pcVar11 = pass_msg();
                        }
                        else {
                          if (pTVar9->msg != (char *)0x0) goto LAB_0010607e;
                          pTVar9->rtype = CK_ERROR;
                          pcVar11 = exit_msg((int)cVar13);
                        }
                        pTVar9->msg = pcVar11;
                        pTVar10 = local_80;
                        pTVar8 = local_90;
                        iVar4 = local_f4;
                      }
                    }
                    else if (__sig == 0) {
                      free(pTVar9->msg);
                      pcVar11 = exit_msg((int)cVar13);
                      pTVar9->msg = pcVar11;
LAB_0010607e:
                      pTVar9->rtype = CK_FAILURE;
                      pTVar10 = local_80;
                      pTVar8 = local_90;
                      iVar4 = local_f4;
                    }
                  }
                  else if (__sig == uVar5) {
                    if (alarm_received == '\x01') {
                      pTVar9->rtype = CK_ERROR;
                      free(pTVar9->msg);
                      __sig = uVar5;
LAB_001060a3:
                      pcVar11 = signal_error_msg(__sig,uVar5);
                    }
                    else {
                      pTVar9->rtype = CK_PASS;
                      free(pTVar9->msg);
                      pcVar11 = pass_msg();
                    }
                    pTVar9->msg = pcVar11;
                    pTVar10 = local_80;
                    pTVar8 = local_90;
                    iVar4 = local_f4;
                  }
                  else {
                    pTVar9->rtype = CK_ERROR;
                    free(pTVar9->msg);
                    if (uVar5 != 0) goto LAB_001060a3;
                    pcVar11 = (char *)emalloc(100);
                    if (alarm_received == '\x01') {
                      builtin_strncpy(pcVar11,"Test timeout expired",0x15);
                    }
                    else {
                      pcVar12 = strsignal(__sig);
                      snprintf(pcVar11,100,"Received signal %d (%s)",(ulong)__sig,pcVar12);
                    }
                    pTVar9->msg = pcVar11;
                    pTVar10 = local_80;
                    pTVar8 = local_90;
                    iVar4 = local_f4;
                  }
LAB_00106106:
                  srunner_add_failure(sr,pTVar9);
                  log_test_end(sr,pTVar9);
                }
                check_list_advance(local_98);
              }
              pLVar14 = pTVar8->unch_tflst;
              fVar3 = srunner_fork_status(sr);
              srunner_run_teardown(pLVar14,fVar3);
              pcVar11 = local_e0;
            }
            else {
              srunner_add_failure(sr,pTVar9);
              pcVar11 = local_e0;
            }
          }
          pLVar14 = local_a0;
          check_list_advance(local_a0);
        }
        log_suite_end(sr,local_b0);
      }
      pLVar14 = local_a8;
      check_list_advance(local_a8);
    }
    check_list_apply(local_c8,free);
    pLVar14 = local_d0;
    check_list_apply(local_d0,free);
    check_list_free(lp);
    check_list_free(pLVar14);
    log_srunner_end(sr);
    srunner_end_logging(sr);
    teardown_messaging();
    set_fork_status(CK_FORK);
    sigaction(0xe,(sigaction *)&srunner_run_tagged::sigalarm_old_action,(sigaction *)0x0);
    sigaction(2,(sigaction *)&sigint_old_action,(sigaction *)0x0);
    sigaction(0xf,(sigaction *)&sigterm_old_action,(sigaction *)0x0);
  }
  return;
}

Assistant:

void srunner_run_tagged(SRunner * sr, const char *sname, const char *tcname,
                        const char *include_tags, const char *exclude_tags,
                        enum print_output print_mode)
{
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    static struct sigaction sigalarm_old_action;
    static struct sigaction sigalarm_new_action;
    static struct sigaction sigint_new_action;
    static struct sigaction sigterm_new_action;
#endif /* HAVE_SIGACTION && HAVE_FORK */

    /*  Get the selected test suite and test case from the
       environment.  */
    if(!tcname)
        tcname = getenv("CK_RUN_CASE");
    if(!sname)
        sname = getenv("CK_RUN_SUITE");
    if(!include_tags)
        include_tags = getenv("CK_INCLUDE_TAGS");
    if(!exclude_tags)
        exclude_tags = getenv("CK_EXCLUDE_TAGS");

    if(sr == NULL)
        return;
    if(print_mode >= CK_LAST)
    {
        eprintf("Bad print_mode argument to srunner_run_all: %d",
                __FILE__, __LINE__, print_mode);
    }
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    memset(&sigalarm_new_action, 0, sizeof(sigalarm_new_action));
    sigalarm_new_action.sa_handler = sig_handler;
    sigaction(SIGALRM, &sigalarm_new_action, &sigalarm_old_action);

    memset(&sigint_new_action, 0, sizeof(sigint_new_action));
    sigint_new_action.sa_handler = sig_handler;
    sigaction(SIGINT, &sigint_new_action, &sigint_old_action);

    memset(&sigterm_new_action, 0, sizeof(sigterm_new_action));
    sigterm_new_action.sa_handler = sig_handler;
    sigaction(SIGTERM, &sigterm_new_action, &sigterm_old_action);
#endif /* HAVE_SIGACTION && HAVE_FORK */
    srunner_run_init(sr, print_mode);
    srunner_iterate_suites(sr, sname, tcname, include_tags, exclude_tags,
                           print_mode);
    srunner_run_end(sr, print_mode);
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    sigaction(SIGALRM, &sigalarm_old_action, NULL);
    sigaction(SIGINT, &sigint_old_action, NULL);
    sigaction(SIGTERM, &sigterm_old_action, NULL);
#endif /* HAVE_SIGACTION && HAVE_FORK */
}